

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowAggStep(WindowCodeArg *p,Window *pMWin,int csr,int bInverse,int reg)

{
  Parse *pParse;
  FuncDef *p_00;
  ExprList *pEVar1;
  int p3;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ExprList *pList;
  Vdbe *p_01;
  Op *pOVar6;
  long lVar7;
  CollSeq *zP4;
  u8 uVar8;
  int p2;
  long lVar9;
  Window *pWVar10;
  u8 *puVar11;
  int local_64;
  
  pParse = p->pParse;
  p_01 = sqlite3GetVdbe(pParse);
  if (pMWin != (Window *)0x0) {
    pWVar10 = pMWin;
    do {
      p_00 = pWVar10->pWFunc;
      iVar4 = 0;
      if (((pWVar10->bExprArgs == '\0') &&
          (pEVar1 = (pWVar10->pOwner->x).pList, pEVar1 != (ExprList *)0x0)) &&
         (iVar4 = pEVar1->nExpr, 0 < iVar4)) {
        iVar3 = 0;
        do {
          if ((iVar3 == 1) && (p_00->zName == "nth_value")) {
            iVar5 = pMWin->iEphCsr;
            p2 = pWVar10->iArgCol + 1;
            p3 = reg + 1;
          }
          else {
            p2 = pWVar10->iArgCol + iVar3;
            iVar5 = csr;
            p3 = reg + iVar3;
          }
          sqlite3VdbeAddOp3(p_01,0x5e,iVar5,p2,p3);
          iVar3 = iVar3 + 1;
        } while (iVar4 != iVar3);
      }
      if (pWVar10->pFilter == (Expr *)0x0) {
        iVar3 = 0;
      }
      else {
        if (pParse->nTempReg == '\0') {
          iVar5 = pParse->nMem + 1;
          pParse->nMem = iVar5;
        }
        else {
          bVar2 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar2;
          iVar5 = pParse->aTempReg[bVar2];
        }
        sqlite3VdbeAddOp3(p_01,0x5e,csr,pWVar10->iArgCol + iVar4,iVar5);
        iVar3 = sqlite3VdbeAddOp3(p_01,0x11,iVar5,0,1);
        if (iVar5 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = iVar5;
          }
        }
      }
      if (((pMWin->regStartRowid == 0) && ((p_00->funcFlags & 0x1000) != 0)) &&
         (pWVar10->eStart != '[')) {
        iVar4 = sqlite3VdbeAddOp3(p_01,0x33,reg,0,0);
        if (bInverse == 0) {
          sqlite3VdbeAddOp3(p_01,0x56,pWVar10->regApp + 1,1,0);
          sqlite3VdbeAddOp3(p_01,0x51,reg,pWVar10->regApp,0);
          sqlite3VdbeAddOp3(p_01,0x61,pWVar10->regApp,2,pWVar10->regApp + 2);
          sqlite3VdbeAddOp3(p_01,0x8a,pWVar10->csrApp,pWVar10->regApp + 2,0);
          iVar5 = p_01->nOp;
          uVar8 = p_01->db->mallocFailed;
        }
        else {
          sqlite3VdbeAddOp4Int(p_01,0x17,pWVar10->csrApp,0,reg,1);
          sqlite3VdbeAddOp3(p_01,0x82,pWVar10->csrApp,0,0);
          iVar5 = p_01->nOp;
          uVar8 = p_01->db->mallocFailed;
          pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (uVar8 == '\0') {
            pOVar6 = p_01->aOp + (long)iVar5 + -2;
          }
          pOVar6->p2 = iVar5;
        }
        pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (uVar8 == '\0') {
          pOVar6 = p_01->aOp + iVar4;
        }
        pOVar6->p2 = iVar5;
      }
      else if (pWVar10->regApp == 0) {
        if (p_00->xSFunc != noopStepFunc) {
          local_64 = reg;
          if (pWVar10->bExprArgs != '\0') {
            iVar5 = p_01->nOp;
            iVar4 = ((pWVar10->pOwner->x).pList)->nExpr;
            local_64 = sqlite3GetTempRange(pParse,iVar4);
            sqlite3ExprCodeExprList(pParse,(pWVar10->pOwner->x).pList,local_64,0,'\0');
            if (iVar5 < p_01->nOp) {
              uVar8 = p_01->db->mallocFailed;
              lVar9 = (long)iVar5 * 0x18;
              lVar7 = (long)p_01->nOp - (long)iVar5;
              do {
                puVar11 = &sqlite3VdbeGetOp_dummy;
                if (uVar8 == '\0') {
                  puVar11 = &p_01->aOp->opcode + lVar9;
                }
                if ((*puVar11 == '^') && (*(int *)(puVar11 + 4) == pMWin->iEphCsr)) {
                  *(int *)(puVar11 + 4) = csr;
                }
                lVar9 = lVar9 + 0x18;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
          }
          if ((p_00->funcFlags & 0x20) != 0) {
            zP4 = sqlite3ExprCollSeq(pParse,((pWVar10->pOwner->x).pList)->a[0].pExpr);
            if (zP4 == (CollSeq *)0x0) {
              zP4 = pParse->db->pDfltColl;
            }
            iVar5 = sqlite3VdbeAddOp3(p_01,0x55,0,0,0);
            sqlite3VdbeChangeP4(p_01,iVar5,(char *)zP4,-2);
          }
          sqlite3VdbeAddOp3(p_01,(bInverse == 0) + 0xa1,bInverse,local_64,pWVar10->regAccum);
          if (p_01->db->mallocFailed == '\0') {
            pOVar6 = p_01->aOp;
            iVar5 = p_01->nOp;
            pOVar6[(long)iVar5 + -1].p4type = -7;
            pOVar6[(long)iVar5 + -1].p4.pKeyInfo = (KeyInfo *)p_00;
          }
          else if ((p_00->funcFlags & 0x10) != 0) {
            sqlite3DbNNFreeNN(p_01->db,p_00);
          }
          if (0 < (long)p_01->nOp) {
            p_01->aOp[(long)p_01->nOp + -1].p5 = (u16)iVar4;
          }
          if (pWVar10->bExprArgs != '\0') {
            if (iVar4 == 1) {
              if (local_64 != 0) {
                bVar2 = pParse->nTempReg;
                if ((ulong)bVar2 < 8) {
                  pParse->nTempReg = bVar2 + 1;
                  pParse->aTempReg[bVar2] = local_64;
                }
              }
            }
            else if (pParse->nRangeReg < iVar4) {
              pParse->nRangeReg = iVar4;
              pParse->iRangeReg = local_64;
            }
          }
        }
      }
      else {
        sqlite3VdbeAddOp3(p_01,0x56,(pWVar10->regApp - bInverse) + 1,1,0);
      }
      if (iVar3 != 0) {
        pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p_01->db->mallocFailed == '\0') {
          pOVar6 = p_01->aOp + iVar3;
        }
        pOVar6->p2 = p_01->nOp;
      }
      pWVar10 = pWVar10->pNextWin;
    } while (pWVar10 != (Window *)0x0);
  }
  return;
}

Assistant:

static void windowAggStep(
  WindowCodeArg *p,
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pWFunc;
    int regArg;
    int nArg = pWin->bExprArgs ? 0 : windowArgCount(pWin);
    int i;
    int addrIf = 0;

    assert( bInverse==0 || pWin->eStart!=TK_UNBOUNDED );

    /* All OVER clauses in the same window function aggregate step must
    ** be the same. */
    assert( pWin==pMWin || sqlite3WindowCompare(pParse,pWin,pMWin,0)!=1 );

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pWin->pFilter ){
      int regTmp;
      assert( ExprUseXList(pWin->pOwner) );
      assert( pWin->bExprArgs || !nArg ||nArg==pWin->pOwner->x.pList->nExpr );
      assert( pWin->bExprArgs || nArg  ||pWin->pOwner->x.pList==0 );
      regTmp = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
      addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regTmp);
    }

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pWin->pFilter==0 );
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      if( pWin->bExprArgs ){
        int iOp = sqlite3VdbeCurrentAddr(v);
        int iEnd;

        assert( ExprUseXList(pWin->pOwner) );
        nArg = pWin->pOwner->x.pList->nExpr;
        regArg = sqlite3GetTempRange(pParse, nArg);
        sqlite3ExprCodeExprList(pParse, pWin->pOwner->x.pList, regArg, 0, 0);

        for(iEnd=sqlite3VdbeCurrentAddr(v); iOp<iEnd; iOp++){
          VdbeOp *pOp = sqlite3VdbeGetOp(v, iOp);
          if( pOp->opcode==OP_Column && pOp->p1==pMWin->iEphCsr ){
            pOp->p1 = csr;
          }
        }
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        assert( ExprUseXList(pWin->pOwner) );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep,
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      if( pWin->bExprArgs ){
        sqlite3ReleaseTempRange(pParse, regArg, nArg);
      }
    }

    if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
  }
}